

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clEnqueueCommandBufferKHR
                 (cl_uint num_queues,cl_command_queue *queues,cl_command_buffer_khr command_buffer,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  _Rb_tree_header *p_Var1;
  CTracker *pCVar2;
  bool bVar3;
  CLIntercept *this;
  _func_cl_int_cl_uint_cl_command_queue_ptr_cl_command_buffer_khr_cl_uint_cl_event_ptr_cl_event_ptr
  *p_Var4;
  uint errorCode;
  int iVar5;
  cl_int errorCode_00;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  uint64_t enqueueCounter;
  time_point tVar8;
  time_point tVar9;
  _Base_ptr p_Var10;
  cl_event *pp_Var11;
  _Base_ptr p_Var12;
  cl_command_queue *pp_Var13;
  cl_int cVar14;
  bool bVar15;
  bool bVar16;
  string queueList;
  cl_event local_event;
  string eventWaitListString;
  string local_e8;
  cl_command_queue local_c8;
  cl_event *local_c0;
  time_point local_b8;
  cl_event *local_b0;
  _func_cl_int_cl_uint_cl_command_queue_ptr_cl_command_buffer_khr_cl_uint_cl_event_ptr_cl_event_ptr
  *local_a8;
  time_point local_a0;
  string local_98;
  string local_78;
  cl_event local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  p_Var1 = &(g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  p_Var12 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(cl_command_buffer_khr *)(p_Var6 + 1) < command_buffer]) {
    if (*(cl_command_buffer_khr *)(p_Var6 + 1) >= command_buffer) {
      p_Var12 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
     (p_Var6 = p_Var12, command_buffer < *(cl_command_buffer_khr *)(p_Var12 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    p_Var6 = (_Base_ptr)0x0;
  }
  else {
    p_Var6 = p_Var6[1]._M_parent;
  }
  p_Var1 = &(g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = (g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var10 = &p_Var1->_M_header;
  for (; p_Var12 != (_Base_ptr)0x0;
      p_Var12 = (&p_Var12->_M_left)[*(_Base_ptr *)(p_Var12 + 1) < p_Var6]) {
    if (*(_Base_ptr *)(p_Var12 + 1) >= p_Var6) {
      p_Var10 = p_Var12;
    }
  }
  p_Var12 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
     (p_Var12 = p_Var10, p_Var6 < *(_Base_ptr *)(p_Var10 + 1))) {
    p_Var12 = &p_Var1->_M_header;
  }
  local_c0 = event;
  if ((_Rb_tree_header *)p_Var12 == p_Var1) {
    local_e8._M_dataplus._M_p = (pointer)0x0;
    pmVar7 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&g_pIntercept->m_DispatchX,(key_type *)&local_e8);
  }
  else {
    pmVar7 = (mapped_type *)&p_Var12[1]._M_parent;
  }
  local_a8 = pmVar7->clEnqueueCommandBufferKHR;
  if (local_a8 !=
      (_func_cl_int_cl_uint_cl_command_queue_ptr_cl_command_buffer_khr_cl_uint_cl_event_ptr_cl_event_ptr
       *)0x0) {
    local_b0 = event_wait_list;
    enqueueCounter = CLIntercept::incrementEnqueueCounter(this);
    local_c8 = CLIntercept::getCommandBufferCommandQueue(this,num_queues,queues,command_buffer);
    if (((((this->m_Config).AubCapture == true) &&
         ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
        (enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue)) &&
       ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
      CLIntercept::startAubCapture
                (this,"clEnqueueCommandBufferKHR",enqueueCounter,(cl_kernel)0x0,0,(size_t *)0x0,
                 (size_t *)0x0,local_c8);
    }
    pp_Var11 = local_b0;
    pp_Var13 = (cl_command_queue *)0x0;
    if ((this->m_Config).NullEnqueue == false) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      if ((this->m_Config).CallLogging == true) {
        CLIntercept::getObjectListString<_cl_command_queue*>(this,num_queues,queues,&local_e8);
        getFormattedEventWaitList_abi_cxx11_(&local_98,this,num_events_in_wait_list,pp_Var11);
        std::__cxx11::string::operator=((string *)&local_50,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      }
      pp_Var11 = local_b0;
      if ((this->m_Config).CallLogging == true) {
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueCommandBufferKHR",enqueueCounter,(cl_kernel)0x0,
                   "queues = %s, command_buffer = %p%s",local_e8._M_dataplus._M_p,command_buffer,
                   local_50);
      }
      if ((this->m_Config).EventChecking == true) {
        CLIntercept::checkEventList
                  (this,"clEnqueueCommandBufferKHR",num_events_in_wait_list,pp_Var11,local_c0);
      }
      local_58 = (cl_event)0x0;
      if ((((this->m_Config).DevicePerformanceTiming == false) &&
          ((this->m_Config).ITTPerformanceTiming == false)) &&
         (((this->m_Config).ChromePerformanceTiming == false &&
          ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
        local_a0.__d.__r = (duration)0;
        bVar15 = false;
      }
      else {
        local_a0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        bVar15 = local_c0 == (cl_event *)0x0;
        if (bVar15) {
          local_c0 = &local_58;
        }
      }
      if (((this->m_Config).HostPerformanceTiming == false) &&
         ((this->m_Config).ChromeCallLogging != true)) {
        local_b8.__d.__r = (duration)0;
      }
      else {
        local_b8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      }
      pp_Var11 = local_c0;
      errorCode = (*pmVar7->clEnqueueCommandBufferKHR)
                            (num_queues,queues,command_buffer,num_events_in_wait_list,local_b0,
                             local_c0);
      pp_Var13 = (cl_command_queue *)(ulong)errorCode;
      if (((this->m_Config).HostPerformanceTiming == false) &&
         ((this->m_Config).ChromeCallLogging != true)) {
        tVar8.__d.__r = (duration)0;
      }
      else {
        tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        if (((this->m_Config).HostPerformanceTiming == true) &&
           (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
            (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
          CLIntercept::updateHostTimingStats
                    (this,"clEnqueueCommandBufferKHR",&local_98,local_b8,tVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
        }
      }
      if ((((this->m_Config).DevicePerformanceTiming == false) &&
          ((this->m_Config).ITTPerformanceTiming == false)) &&
         ((this->m_Config).ChromePerformanceTiming == false)) {
        if ((pp_Var11 != (cl_event *)0x0) &&
           ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_00140262:
          bVar3 = false;
          if (enqueueCounter < (this->m_Config).DevicePerformanceTimingMinEnqueue) {
            bVar16 = false;
          }
          else {
            bVar16 = false;
            if (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue) {
              if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
                local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_98,"clEnqueueCommandBufferKHR","");
                iVar5 = std::__cxx11::string::compare((char *)&local_98);
                bVar16 = iVar5 != 0;
                bVar3 = true;
              }
              else {
                bVar16 = true;
                bVar3 = false;
              }
            }
          }
          if ((bVar3) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2)) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          pp_Var11 = local_c0;
          if (bVar16) {
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
            CLIntercept::addTimingEvent
                      (this,"clEnqueueCommandBufferKHR",enqueueCounter,local_a0,&local_78,local_c8,
                       *pp_Var11);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
          }
          if (bVar15) {
            (*(this->m_Dispatch).clReleaseEvent)(*pp_Var11);
            goto LAB_0014036c;
          }
        }
      }
      else {
        if (pp_Var11 != (cl_event *)0x0) goto LAB_00140262;
LAB_0014036c:
        pp_Var11 = (cl_event *)0x0;
      }
      bVar15 = (this->m_Config).ErrorLogging;
      if ((bVar15 == false) && ((this->m_Config).ErrorAssert == false)) {
        if ((errorCode != 0) && ((this->m_Config).NoErrors != false)) {
LAB_00140399:
          if (bVar15 != false) {
            CLIntercept::logError(this,"clEnqueueCommandBufferKHR",errorCode);
          }
          if ((this->m_Config).ErrorAssert == true) {
            raise(5);
          }
          if ((this->m_Config).NoErrors != false) {
            pp_Var13 = (cl_command_queue *)0x0;
          }
        }
      }
      else {
        if (errorCode != 0) goto LAB_00140399;
        pp_Var13 = (cl_command_queue *)0x0;
      }
      if (((pp_Var11 != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
         (*pp_Var11 != (cl_event)0x0)) {
        LOCK();
        pCVar2 = &(this->m_ObjectTracker).m_Events;
        (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i =
             (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
      }
      if ((this->m_Config).CallLogging == true) {
        CLIntercept::callLoggingExit
                  (this,"clEnqueueCommandBufferKHR",(cl_int)pp_Var13,pp_Var11,
                   (cl_sync_point_khr *)0x0);
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"clEnqueueCommandBufferKHR",&local_78,true,enqueueCounter,local_b8,tVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      if (((pp_Var11 != (cl_event *)0x0) && (*pp_Var11 != (cl_event)0x0)) &&
         (((this->m_Config).ChromeCallLogging != false ||
          ((this->m_Config).ChromePerformanceTiming == true)))) {
        CLIntercept::addEvent(this,*pp_Var11,enqueueCounter);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
    }
    queues = pp_Var13;
    cVar14 = (cl_int)queues;
    if ((this->m_Config).FinishAfterEnqueue == true) {
      if (((this->m_Config).ToolOverheadTiming == true) &&
         (((this->m_Config).HostPerformanceTiming != false ||
          ((this->m_Config).ChromeCallLogging == true)))) {
        tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      }
      else {
        tVar8.__d.__r = (duration)0;
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueCommandBufferKHR");
      errorCode_00 = (*(this->m_Dispatch).clFinish)(local_c8);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (this,"clFinish","clEnqueueCommandBufferKHR",errorCode_00);
      if (((this->m_Config).ToolOverheadTiming == true) &&
         (((this->m_Config).HostPerformanceTiming != false ||
          ((this->m_Config).ChromeCallLogging == true)))) {
        tVar9.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        if (((this->m_Config).HostPerformanceTiming == true) &&
           (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
            (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          CLIntercept::updateHostTimingStats(this,"(finish after enqueue)",&local_e8,tVar8,tVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
        if ((this->m_Config).ChromeCallLogging == true) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          CLIntercept::chromeCallLoggingExit
                    (this,"(finish after enqueue)",&local_e8,false,0,tVar8,tVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
      }
      if (((this->m_Config).ToolOverheadTiming == true) &&
         (((this->m_Config).HostPerformanceTiming != false ||
          ((this->m_Config).ChromeCallLogging == true)))) {
        tVar8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      }
      else {
        tVar8.__d.__r = (duration)0;
      }
      CLIntercept::checkTimingEvents(this);
      if (((this->m_Config).ToolOverheadTiming == true) &&
         (((this->m_Config).HostPerformanceTiming != false ||
          ((this->m_Config).ChromeCallLogging == true)))) {
        tVar9.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        if (((this->m_Config).HostPerformanceTiming == true) &&
           (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
            (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          CLIntercept::updateHostTimingStats(this,"(device timing overhead)",&local_e8,tVar8,tVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
        if ((this->m_Config).ChromeCallLogging == true) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
          CLIntercept::chromeCallLoggingExit
                    (this,"(device timing overhead)",&local_e8,false,0,tVar8,tVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p);
          }
        }
      }
    }
    else if ((this->m_Config).FlushAfterEnqueue == true) {
      (*(this->m_Dispatch).clFlush)(local_c8);
    }
    p_Var4 = local_a8;
    if ((this->m_Config).AubCapture == true) {
      if ((((this->m_Config).AubCaptureIndividualEnqueues != false) ||
          (enqueueCounter < (this->m_Config).AubCaptureMinEnqueue)) ||
         (local_a8 = p_Var4, (this->m_Config).AubCaptureMaxEnqueue < enqueueCounter)) {
        CLIntercept::stopAubCapture(this,local_c8);
        local_a8 = p_Var4;
      }
      goto LAB_0014078f;
    }
  }
  cVar14 = (cl_int)queues;
LAB_0014078f:
  if (local_a8 ==
      (_func_cl_int_cl_uint_cl_command_queue_ptr_cl_command_buffer_khr_cl_uint_cl_event_ptr_cl_event_ptr
       *)0x0) {
    return -0x472;
  }
  return cVar14;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueCommandBufferKHR(
    cl_uint num_queues,
    cl_command_queue* queues,
    cl_command_buffer_khr command_buffer,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clEnqueueCommandBufferKHR )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            COMMAND_BUFFER_GET_QUEUE( num_queues, queues, command_buffer );
            CHECK_AUBCAPTURE_START( command_queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                std::string queueList;
                std::string eventWaitListString;
                if( pIntercept->config().CallLogging )
                {
                    pIntercept->getObjectListString(
                        num_queues,
                        queues,
                        queueList );
                    eventWaitListString = getFormattedEventWaitList(
                        pIntercept,
                        num_events_in_wait_list,
                        event_wait_list);
                }
                CALL_LOGGING_ENTER( "queues = %s, command_buffer = %p%s",
                    queueList.c_str(),
                    command_buffer,
                    eventWaitListString.c_str() );
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueCommandBufferKHR(
                    num_queues,
                    queues,
                    command_buffer,
                    num_events_in_wait_list,
                    event_wait_list,
                    event);

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
            CHECK_AUBCAPTURE_STOP( command_queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}